

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall
libtorrent::dht::node::verify_token
          (node *this,string_view token,sha1_hash *info_hash,endpoint *addr)

{
  dht_observer *pdVar1;
  bool bVar2;
  char *__first1;
  bool bVar3;
  span<const_char> data;
  span<const_char> data_00;
  span<const_char> data_01;
  span<const_char> data_02;
  hasher h2;
  hasher h1;
  sha1_hash h;
  undefined4 uStack_74;
  string address;
  sha1_hash local_3c;
  
  __first1 = token._M_str;
  if (token._M_len == 4) {
    lcrypto::hasher::hasher(&h1);
    bVar3 = (addr->impl_).data_.base.sa_family != 2;
    if (bVar3) {
      h.m_number._M_elems._8_8_ = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
      unique0x1000023f = *(undefined8 *)((long)&(addr->impl_).data_ + 0x10);
      h.m_number._M_elems[1] = 0;
    }
    else {
      h.m_number._M_elems[1] = (addr->impl_).data_.v6.sin6_flowinfo;
      h.m_number._M_elems[2] = 0;
      h.m_number._M_elems[3] = 0;
      stack0xffffffffffffff88 = 0;
    }
    h.m_number._M_elems[0] = (uint)bVar3;
    boost::asio::ip::address::to_string_abi_cxx11_(&address,(address *)&h);
    lcrypto::hasher::update(&h1,(span<const_char>)address._0_16_);
    data.m_len = 4;
    data.m_ptr = this->m_secret[0]._M_elems;
    lcrypto::hasher::update(&h1,data);
    data_00.m_len = 0x14;
    data_00.m_ptr = (char *)info_hash;
    lcrypto::hasher::update(&h1,data_00);
    lcrypto::hasher::final(&h,&h1);
    bVar2 = ::std::__equal<true>::equal<char>(__first1,__first1 + 4,(char *)&h);
    bVar3 = true;
    if (!bVar2) {
      lcrypto::hasher::hasher(&h2);
      lcrypto::hasher::update(&h2,(span<const_char>)address._0_16_);
      data_01.m_len = 4;
      data_01.m_ptr = this->m_secret[1]._M_elems;
      lcrypto::hasher::update(&h2,data_01);
      data_02.m_len = 0x14;
      data_02.m_ptr = (char *)info_hash;
      lcrypto::hasher::update(&h2,data_02);
      lcrypto::hasher::final(&local_3c,&h2);
      h.m_number._M_elems[4] = local_3c.m_number._M_elems[4];
      h.m_number._M_elems[0] = local_3c.m_number._M_elems[0];
      h.m_number._M_elems[1] = local_3c.m_number._M_elems[1];
      h.m_number._M_elems[2] = local_3c.m_number._M_elems[2];
      h.m_number._M_elems[3] = local_3c.m_number._M_elems[3];
      bVar3 = ::std::__equal<true>::equal<char>(__first1,__first1 + 4,(char *)&h);
      lcrypto::hasher::~hasher(&h2);
    }
    ::std::__cxx11::string::~string((string *)&address);
    lcrypto::hasher::~hasher(&h1);
  }
  else {
    pdVar1 = this->m_observer;
    if (pdVar1 == (dht_observer *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"token of incorrect length: %d",token._M_len);
    }
  }
  return bVar3;
}

Assistant:

bool node::verify_token(string_view token, sha1_hash const& info_hash
	, udp::endpoint const& addr) const
{
	if (token.length() != write_token_size)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (m_observer != nullptr)
		{
			m_observer->log(dht_logger::node, "token of incorrect length: %d"
				, int(token.length()));
		}
#endif
		return false;
	}

	hasher h1;
	std::string const address = addr.address().to_string();
	h1.update(address);
	h1.update(m_secret[0]);
	h1.update(info_hash);

	sha1_hash h = h1.final();
	if (std::equal(token.begin(), token.end(), reinterpret_cast<char*>(&h[0])))
		return true;

	hasher h2;
	h2.update(address);
	h2.update(m_secret[1]);
	h2.update(info_hash);
	h = h2.final();
	return std::equal(token.begin(), token.end(), reinterpret_cast<char*>(&h[0]));
}